

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  BYTE *iEnd;
  int *iStart;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  uint uVar8;
  uint uVar9;
  BYTE *op;
  size_t sVar10;
  BYTE *pBVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  BYTE *pBVar15;
  int *piVar16;
  ulong uVar17;
  BYTE *pBVar18;
  int *piVar19;
  seqDef *psVar20;
  BYTE *ip;
  U32 UVar21;
  U32 UVar22;
  ulong uVar23;
  uint uVar24;
  U32 UVar26;
  ulong uVar27;
  int *piVar28;
  int *piVar29;
  U32 UVar30;
  int *piVar31;
  ulong uVar25;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  UVar21 = *rep;
  UVar30 = rep[1];
  if (src < piVar1) {
    pUVar5 = ms->hashTable;
    pBVar6 = (ms->window).base;
    pBVar7 = (ms->window).dictBase;
    uVar2 = (ms->window).lowLimit;
    uVar3 = (ms->window).dictLimit;
    iStart = (int *)(pBVar6 + uVar3);
    pBVar18 = pBVar7 + uVar3;
    uVar4 = (ms->cParams).targetLength;
    bVar13 = 0x20 - (char)(ms->cParams).hashLog;
    uVar24 = mls - 5;
    uVar25 = (ulong)uVar24;
    piVar29 = (int *)src;
    do {
      if (uVar24 < 4) {
        sVar10 = (*(code *)(&DAT_00564ec4 + *(int *)(&DAT_00564ec4 + uVar25 * 4)))();
        return sVar10;
      }
      uVar8 = (uint)(*piVar29 * -0x61c8864f) >> (bVar13 & 0x1f);
      uVar9 = pUVar5[uVar8];
      pBVar15 = pBVar6;
      if (uVar9 < uVar3) {
        pBVar15 = pBVar7;
      }
      uVar27 = (long)piVar29 - (long)pBVar6;
      UVar26 = (U32)uVar27;
      uVar14 = (UVar26 - UVar21) + 1;
      pBVar11 = pBVar6;
      if (uVar14 < uVar3) {
        pBVar11 = pBVar7;
      }
      pUVar5[uVar8] = UVar26;
      if ((uVar2 < uVar14 && 2 < (uVar3 - 1) - uVar14) &&
         (*(int *)(pBVar11 + uVar14) == *(int *)((long)piVar29 + 1))) {
        piVar28 = (int *)((long)piVar29 + 1);
        pBVar15 = iEnd;
        if (uVar14 < uVar3) {
          pBVar15 = pBVar18;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar29 + 5),(BYTE *)((long)(pBVar11 + uVar14) + 4),iEnd,
                            pBVar15,(BYTE *)iStart);
        uVar23 = (long)piVar28 - (long)src;
        pBVar11 = seqStore->lit;
        pBVar15 = pBVar11 + uVar23;
        do {
          *(undefined8 *)pBVar11 = *src;
          pBVar11 = pBVar11 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar11 < pBVar15);
        seqStore->lit = seqStore->lit + uVar23;
        if (uVar23 < 0x10000) {
          psVar20 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar20 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar12 = sVar10 + 4;
        uVar17 = sVar10 + 1;
        psVar20->litLength = (U16)uVar23;
        psVar20->offset = 1;
        UVar22 = UVar21;
joined_r0x00458531:
        UVar21 = UVar22;
        if (0xffff < uVar17) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar12 + (long)piVar28);
        psVar20->matchLength = (U16)uVar17;
        seqStore->sequences = psVar20 + 1;
        piVar29 = (int *)src;
        if (src <= piVar1) {
          if (uVar24 < 4) {
            sVar10 = (*(code *)(&DAT_00564ed4 + *(int *)(&DAT_00564ed4 + uVar25 * 4)))();
            return sVar10;
          }
          pUVar5[(uint)(*(int *)(pBVar6 + (uVar27 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar13 & 0x1f)] = UVar26 + 2;
          pUVar5[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
               ((int)src + -2) - (int)pBVar6;
          UVar26 = UVar30;
          do {
            UVar30 = UVar26;
            UVar26 = UVar21;
            UVar22 = (int)src - (int)pBVar6;
            uVar9 = UVar22 - UVar30;
            pBVar15 = pBVar6;
            if (uVar9 < uVar3) {
              pBVar15 = pBVar7;
            }
            piVar29 = (int *)src;
            UVar21 = UVar26;
            if (((uVar9 <= uVar2) || ((uVar3 - 1) - uVar9 < 3)) ||
               (*(int *)(pBVar15 + uVar9) != *src)) break;
            pBVar11 = iEnd;
            if (uVar9 < uVar3) {
              pBVar11 = pBVar18;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar15 + uVar9) + 4),iEnd,
                                pBVar11,(BYTE *)iStart);
            *(undefined8 *)seqStore->lit = *src;
            psVar20 = seqStore->sequences;
            psVar20->litLength = 0;
            psVar20->offset = 1;
            if (0xffff < sVar10 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar20->matchLength = (U16)(sVar10 + 1);
            seqStore->sequences = psVar20 + 1;
            if (uVar24 < 4) {
              sVar10 = (*(code *)(&DAT_00564ee4 + *(int *)(&DAT_00564ee4 + uVar25 * 4)))();
              return sVar10;
            }
            pUVar5[(uint)(*src * -0x61c8864f) >> (bVar13 & 0x1f)] = UVar22;
            src = (void *)((long)src + sVar10 + 4);
            piVar29 = (int *)src;
            UVar21 = UVar30;
            UVar30 = UVar26;
          } while (src <= piVar1);
        }
      }
      else {
        if ((uVar2 <= uVar9) && (piVar19 = (int *)(pBVar15 + uVar9), *piVar19 == *piVar29)) {
          piVar31 = iStart;
          pBVar11 = iEnd;
          if (uVar9 < uVar3) {
            piVar31 = (int *)(pBVar7 + uVar2);
            pBVar11 = pBVar18;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)(piVar29 + 1),(BYTE *)(piVar19 + 1),iEnd,pBVar11,
                              (BYTE *)iStart);
          lVar12 = sVar10 + 4;
          piVar28 = piVar29;
          if ((piVar31 < piVar19) && (src < piVar29)) {
            piVar19 = (int *)(pBVar15 + uVar9);
            do {
              piVar19 = (int *)((long)piVar19 + -1);
              piVar16 = (int *)((long)piVar29 + -1);
              piVar28 = piVar29;
              if ((*(BYTE *)piVar16 != *(BYTE *)piVar19) ||
                 (lVar12 = lVar12 + 1, piVar28 = piVar16, piVar19 <= piVar31)) break;
              piVar29 = piVar16;
            } while (src < piVar16);
          }
          uVar23 = (long)piVar28 - (long)src;
          pBVar11 = seqStore->lit;
          pBVar15 = pBVar11 + uVar23;
          do {
            *(undefined8 *)pBVar11 = *src;
            pBVar11 = pBVar11 + 8;
            src = (void *)((long)src + 8);
          } while (pBVar11 < pBVar15);
          seqStore->lit = seqStore->lit + uVar23;
          if (uVar23 < 0x10000) {
            psVar20 = seqStore->sequences;
          }
          else {
            seqStore->longLengthID = 1;
            psVar20 = seqStore->sequences;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          uVar17 = lVar12 - 3;
          psVar20->litLength = (U16)uVar23;
          psVar20->offset = (UVar26 - uVar9) + 3;
          UVar22 = UVar26 - uVar9;
          UVar30 = UVar21;
          goto joined_r0x00458531;
        }
        piVar29 = (int *)((long)piVar29 +
                         ((long)piVar29 - (long)src >> 8) + (ulong)(uVar4 + (uVar4 == 0)));
      }
    } while (piVar29 < piVar1);
  }
  *rep = UVar21;
  rep[1] = UVar30;
  return (long)iEnd - (long)src;
}

Assistant:

static size_t ZSTD_compressBlock_fast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize, U32 const mls)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashTable = ms->hashTable;
    U32 const hlog = cParams->hashLog;
    /* support stepSize of 0 */
    U32 const stepSize = cParams->targetLength + !(cParams->targetLength);
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    U32 offset_1=rep[0], offset_2=rep[1];

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t h = ZSTD_hashPtr(ip, hlog, mls);
        const U32    matchIndex = hashTable[h];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE*  match = matchBase + matchIndex;
        const U32    current = (U32)(ip-base);
        const U32    repIndex = current + 1 - offset_1;
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashTable[h] = current;   /* update hash table */
        assert(offset_1 <= current +1);   /* check repIndex */

        if ( (((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow */ & (repIndex > dictStartIndex))
           && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ( (matchIndex < dictStartIndex) ||
                 (MEM_read32(match) != MEM_read32(ip)) ) {
                assert(stepSize >= 1);
                ip += ((ip-anchor) >> kSearchStrength) + stepSize;
                continue;
            }
            {   const BYTE* matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                offset = current - matchIndex;
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashTable[ZSTD_hashPtr(base+current+2, hlog, mls)] = current+2;
            hashTable[ZSTD_hashPtr(ip-2, hlog, mls)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3) & (repIndex2 > dictStartIndex))  /* intentional overflow */
                   && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashTable[ZSTD_hashPtr(ip, hlog, mls)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}